

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  string hack;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string hack_cmd;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# Special targets provided by cmake.\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &hack.field_2;
  hack._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,".SUFFIXES","");
  WriteMakeRule(this,makefileStream,"Disable implicit rules so canonical targets will work.",&hack,
                &no_depends,&no_commands,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
  if (!bVar5) {
    bVar5 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
    if ((!bVar5) && (this->BorlandMakeCurlyHack == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                (makefileStream,"# Remove some rules from gmake that .SUFFIXES does not remove.\n",
                 0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"SUFFIXES =\n\n",0xc);
    }
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             (char (*) [29])".hpux_make_needs_suffix_list");
  hack._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,".SUFFIXES","");
  WriteMakeRule(this,makefileStream,(char *)0x0,&hack,&depends,&no_commands,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n.ERASE\n\n",9);
  }
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  hack._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&hack,"CMAKE_VERBOSE_MAKEFILE","");
  bVar5 = cmMakefile::IsOn(this_00,&hack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,"# Produce verbose output by default.\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"VERBOSE = 1\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  }
  bVar5 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,"!ifndef VERBOSE\n.SILENT\n!endif\n\n",0x20);
  }
  else {
    hack._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&hack,"$(VERBOSE).SILENT","");
    WriteMakeRule(this,makefileStream,"Suppress display of executed commands.",&hack,&no_depends,
                  &no_commands,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)hack._M_dataplus._M_p != paVar1) {
      operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  lVar3 = *(long *)((long)&pcVar2[1].MakeSilentFlag.field_2 + 8);
  hack._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&hack,lVar3,*(long *)&pcVar2[1].RecursionDepth + lVar3);
  if (hack._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&no_depends,
               &hack);
  }
  sVar4 = pcVar2[1].FindMakeProgramFile.field_2._M_allocated_capacity;
  hack_cmd._M_dataplus._M_p = (pointer)&hack_cmd.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&hack_cmd,sVar4,
             *(long *)((long)&pcVar2[1].FindMakeProgramFile.field_2 + 8) + sVar4);
  if (hack_cmd._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&no_commands,
               &hack_cmd);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cmake_force","");
  WriteMakeRule(this,makefileStream,"A target that is always out of date.",&local_68,&no_depends,
                &no_commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  WriteMakeVariables(this,makefileStream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack_cmd._M_dataplus._M_p != &hack_cmd.field_2) {
    operator_delete(hack_cmd._M_dataplus._M_p,hack_cmd.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hack._M_dataplus._M_p != paVar1) {
    operator_delete(hack._M_dataplus._M_p,hack.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_commands);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Special targets provided by cmake.\n"
                 << "\n";

  std::vector<std::string> no_commands;
  std::vector<std::string> no_depends;

  // Special target to cleanup operation of make tool.
  // This should be the first target except for the default_target in
  // the interface Makefile.
  this->WriteMakeRule(makefileStream,
                      "Disable implicit rules so canonical targets will work.",
                      ".SUFFIXES", no_depends, no_commands, false);

  if (!this->IsNMake() && !this->IsWatcomWMake() &&
      !this->BorlandMakeCurlyHack) {
    // turn off RCS and SCCS automatic stuff from gmake
    makefileStream
      << "# Remove some rules from gmake that .SUFFIXES does not remove.\n"
      << "SUFFIXES =\n\n";
  }
  // Add a fake suffix to keep HP happy.  Must be max 32 chars for SGI make.
  std::vector<std::string> depends;
  depends.emplace_back(".hpux_make_needs_suffix_list");
  this->WriteMakeRule(makefileStream, nullptr, ".SUFFIXES", depends,
                      no_commands, false);
  if (this->IsWatcomWMake()) {
    // Switch on WMake feature, if an error or interrupt occurs during
    // makefile processing, the current target being made may be deleted
    // without prompting (the same as command line -e option).
    /* clang-format off */
    makefileStream <<
      "\n"
      ".ERASE\n"
      "\n"
      ;
    /* clang-format on */
  }
  if (this->Makefile->IsOn("CMAKE_VERBOSE_MAKEFILE")) {
    /* clang-format off */
    makefileStream
      << "# Produce verbose output by default.\n"
      << "VERBOSE = 1\n"
      << "\n";
    /* clang-format on */
  }
  if (this->IsWatcomWMake()) {
    /* clang-format off */
    makefileStream <<
      "!ifndef VERBOSE\n"
      ".SILENT\n"
      "!endif\n"
      "\n"
      ;
    /* clang-format on */
  } else {
    // Write special target to silence make output.  This must be after
    // the default target in case VERBOSE is set (which changes the
    // name).  The setting of CMAKE_VERBOSE_MAKEFILE to ON will cause a
    // "VERBOSE=1" to be added as a make variable which will change the
    // name of this special target.  This gives a make-time choice to
    // the user.
    this->WriteMakeRule(makefileStream,
                        "Suppress display of executed commands.",
                        "$(VERBOSE).SILENT", no_depends, no_commands, false);
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  std::string hack = gg->GetEmptyRuleHackDepends();
  if (!hack.empty()) {
    no_depends.push_back(std::move(hack));
  }
  std::string hack_cmd = gg->GetEmptyRuleHackCommand();
  if (!hack_cmd.empty()) {
    no_commands.push_back(std::move(hack_cmd));
  }

  // Special symbolic target that never exists to force dependers to
  // run their rules.
  this->WriteMakeRule(makefileStream, "A target that is always out of date.",
                      "cmake_force", no_depends, no_commands, true);

  // Variables for reference by other rules.
  this->WriteMakeVariables(makefileStream);
}